

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O3

Iterator * __thiscall
leveldb::DBImpl::NewInternalIterator
          (DBImpl *this,ReadOptions *options,SequenceNumber *latest_snapshot,uint32_t *seed)

{
  int *piVar1;
  Mutex *__mutex;
  Version *pVVar2;
  MemTable *pMVar3;
  int iVar4;
  uint32_t uVar5;
  Iterator *this_00;
  long *arg1;
  undefined8 uVar6;
  long in_FS_OFFSET;
  vector<leveldb::Iterator_*,_std::allocator<leveldb::Iterator_*>_> list;
  Iterator *local_50;
  vector<leveldb::Iterator_*,_std::allocator<leveldb::Iterator_*>_> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  __mutex = &this->mutex_;
  iVar4 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar4 == 0) {
    *latest_snapshot = this->versions_->last_sequence_;
    local_48.super__Vector_base<leveldb::Iterator_*,_std::allocator<leveldb::Iterator_*>_>._M_impl.
    super__Vector_impl_data._M_start = (Iterator **)0x0;
    local_48.super__Vector_base<leveldb::Iterator_*,_std::allocator<leveldb::Iterator_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.super__Vector_base<leveldb::Iterator_*,_std::allocator<leveldb::Iterator_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_50 = MemTable::NewIterator(this->mem_);
    std::vector<leveldb::Iterator*,std::allocator<leveldb::Iterator*>>::
    emplace_back<leveldb::Iterator*>
              ((vector<leveldb::Iterator*,std::allocator<leveldb::Iterator*>> *)&local_48,&local_50)
    ;
    piVar1 = &this->mem_->refs_;
    *piVar1 = *piVar1 + 1;
    if (this->imm_ != (MemTable *)0x0) {
      local_50 = MemTable::NewIterator(this->imm_);
      std::vector<leveldb::Iterator*,std::allocator<leveldb::Iterator*>>::
      emplace_back<leveldb::Iterator*>
                ((vector<leveldb::Iterator*,std::allocator<leveldb::Iterator*>> *)&local_48,
                 &local_50);
      piVar1 = &this->imm_->refs_;
      *piVar1 = *piVar1 + 1;
    }
    Version::AddIterators(this->versions_->current_,options,&local_48);
    this_00 = NewMergingIterator(&(this->internal_comparator_).super_Comparator,
                                 local_48.
                                 super__Vector_base<leveldb::Iterator_*,_std::allocator<leveldb::Iterator_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start,
                                 (int)((ulong)((long)local_48.
                                                  super__Vector_base<leveldb::Iterator_*,_std::allocator<leveldb::Iterator_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                              (long)local_48.
                                                  super__Vector_base<leveldb::Iterator_*,_std::allocator<leveldb::Iterator_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 3));
    Version::Ref(this->versions_->current_);
    arg1 = (long *)operator_new(0x20);
    pVVar2 = this->versions_->current_;
    *arg1 = (long)__mutex;
    arg1[1] = (long)pVVar2;
    pMVar3 = this->imm_;
    arg1[2] = (long)this->mem_;
    arg1[3] = (long)pMVar3;
    Iterator::RegisterCleanup(this_00,anon_unknown_35::CleanupIteratorState,arg1,(void *)0x0);
    uVar5 = this->seed_ + 1;
    this->seed_ = uVar5;
    *seed = uVar5;
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    if (local_48.super__Vector_base<leveldb::Iterator_*,_std::allocator<leveldb::Iterator_*>_>.
        _M_impl.super__Vector_impl_data._M_start != (Iterator **)0x0) {
      operator_delete(local_48.
                      super__Vector_base<leveldb::Iterator_*,_std::allocator<leveldb::Iterator_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_48.
                            super__Vector_base<leveldb::Iterator_*,_std::allocator<leveldb::Iterator_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.
                            super__Vector_base<leveldb::Iterator_*,_std::allocator<leveldb::Iterator_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      return this_00;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    uVar6 = std::__throw_system_error(iVar4);
    if (local_48.super__Vector_base<leveldb::Iterator_*,_std::allocator<leveldb::Iterator_*>_>.
        _M_impl.super__Vector_impl_data._M_start != (Iterator **)0x0) {
      operator_delete(local_48.
                      super__Vector_base<leveldb::Iterator_*,_std::allocator<leveldb::Iterator_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_48.
                            super__Vector_base<leveldb::Iterator_*,_std::allocator<leveldb::Iterator_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.
                            super__Vector_base<leveldb::Iterator_*,_std::allocator<leveldb::Iterator_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      _Unwind_Resume(uVar6);
    }
  }
  __stack_chk_fail();
}

Assistant:

Iterator* DBImpl::NewInternalIterator(const ReadOptions& options,
                                      SequenceNumber* latest_snapshot,
                                      uint32_t* seed) {
  mutex_.Lock();
  *latest_snapshot = versions_->LastSequence();

  // Collect together all needed child iterators
  std::vector<Iterator*> list;
  list.push_back(mem_->NewIterator());
  mem_->Ref();
  if (imm_ != nullptr) {
    list.push_back(imm_->NewIterator());
    imm_->Ref();
  }
  versions_->current()->AddIterators(options, &list);
  Iterator* internal_iter =
      NewMergingIterator(&internal_comparator_, &list[0], list.size());
  versions_->current()->Ref();

  IterState* cleanup = new IterState(&mutex_, mem_, imm_, versions_->current());
  internal_iter->RegisterCleanup(CleanupIteratorState, cleanup, nullptr);

  *seed = ++seed_;
  mutex_.Unlock();
  return internal_iter;
}